

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

int stbtt_InitFont(stbtt_fontinfo *info,uchar *data,int offset)

{
  int iVar1;
  int offset_local;
  uchar *data_local;
  stbtt_fontinfo *info_local;
  
  iVar1 = stbtt_InitFont_internal(info,data,offset);
  return iVar1;
}

Assistant:

STBTT_DEF int stbtt_InitFont(stbtt_fontinfo *info, const unsigned char *data, int offset)
{
   return stbtt_InitFont_internal(info, (unsigned char *) data, offset);
}